

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

_Bool http_set_known_header(nng_http *conn,char *key,char *val)

{
  int iVar1;
  nng_http_req *local_38;
  nni_http_entity *data;
  char *val_local;
  char *key_local;
  nng_http *conn_local;
  
  iVar1 = nni_strcasecmp(key,"Content-Type");
  if (iVar1 == 0) {
    nni_http_set_content_type(conn,val);
    conn_local._7_1_ = true;
  }
  else {
    iVar1 = nni_strcasecmp(key,"Content-Length");
    if (iVar1 == 0) {
      if ((conn->client & 1U) == 0) {
        local_38 = (nng_http_req *)&conn->res;
      }
      else {
        local_38 = &conn->req;
      }
      snprintf((local_38->data).clen,0x18,"%s",val);
      nni_http_set_static_header
                (conn,&(local_38->data).content_length,"Content-Length",(local_38->data).clen);
      conn_local._7_1_ = true;
    }
    else if (((conn->client & 1U) == 0) || (iVar1 = nni_strcasecmp(key,"Host"), iVar1 != 0)) {
      conn_local._7_1_ = false;
    }
    else {
      nni_http_set_host(conn,val);
      conn_local._7_1_ = true;
    }
  }
  return conn_local._7_1_;
}

Assistant:

static bool
http_set_known_header(nng_http *conn, const char *key, const char *val)
{
	if (nni_strcasecmp(key, "Content-Type") == 0) {
		nni_http_set_content_type(conn, val);
		return (true);
	}
	if (nni_strcasecmp(key, "Content-Length") == 0) {
		nni_http_entity *data =
		    conn->client ? &conn->req.data : &conn->res.data;
		snprintf(data->clen, sizeof(data->clen), "%s", val);
		nni_http_set_static_header(
		    conn, &data->content_length, "Content-Length", data->clen);
		return (true);
	}

	if (conn->client) {
		if (nni_strcasecmp(key, "Host") == 0) {
			nni_http_set_host(conn, val);
			return (true);
		}
	}
	return (false);
}